

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer1.cpp
# Opt level: O0

int main(void)

{
  _func_void *local_38;
  thread local_30;
  thread consThr;
  _func_void_int *local_20;
  thread local_18;
  thread prodThr;
  
  prodThr._M_id._M_thread._4_4_ = 0;
  local_20 = produce;
  consThr._M_id._M_thread._4_4_ = 10;
  std::thread::thread<void(*)(int),int,void>
            (&local_18,&local_20,(int *)((long)&consThr._M_id._M_thread + 4));
  local_38 = consume;
  std::thread::thread<void(*)(),,void>(&local_30,&local_38);
  std::thread::join();
  std::thread::join();
  prodThr._M_id._M_thread._4_4_ = 0;
  std::thread::~thread(&local_30);
  std::thread::~thread(&local_18);
  return prodThr._M_id._M_thread._4_4_;
}

Assistant:

int main() {
    // Run `produce` function on a new thread providing a function argument
    std::thread prodThr(&produce, 10);
    // Run `consume` function on a new thread
    std::thread consThr(&consume);

    // Wait for the threads to terminate before exiting the main function
    prodThr.join();
    consThr.join();

    return 0;
}